

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O0

void process_ack(NMQ *q,uint32_t sn,uint32_t ts_send)

{
  segment *s_00;
  uint32_t uVar1;
  segment *s;
  dlnode *node;
  uint32_t sn_mod;
  uint32_t ts_send_local;
  uint32_t sn_local;
  NMQ *q_local;
  
  uVar1 = modsn(sn,q->MAX_SND_BUF_NUM);
  if (((q->snd_una <= sn) && (sn < q->snd_nxt)) && (q->snd_sn_to_node[uVar1] != (dlnode *)0x0)) {
    if (ts_send != 0) {
      update_rtt(q,sn,ts_send);
    }
    s_00 = (segment *)q->snd_sn_to_node[uVar1];
    dlist_remove_node((dlnode *)s_00);
    q->snd_sn_to_node[uVar1] = (dlnode *)0x0;
    recycle_segment(&q->pool,s_00);
  }
  return;
}

Assistant:

static void process_ack(NMQ *q, uint32_t sn, uint32_t ts_send) {
    uint32_t sn_mod = modsn(sn, q->MAX_SND_BUF_NUM);
    if (sn < q->snd_una || sn >= q->snd_nxt || !q->snd_sn_to_node[sn_mod]) { // sn 0 is valid!!!
        return;
    }
    if (ts_send) {  //  during processing una. just delete segments and do nothing
        update_rtt(q, sn, ts_send);
    }

    dlnode *node = q->snd_sn_to_node[sn_mod];
    dlist_remove_node(node);

    q->snd_sn_to_node[sn_mod] = NULL;
    segment *s = ADDRESS_FOR(segment, head, node);
    recycle_segment(&q->pool, s);
}